

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

void __thiscall
cmCTestBZR::UpdateParser::UpdateParser(UpdateParser *this,cmCTestBZR *bzr,char *prefix)

{
  char *prefix_local;
  cmCTestBZR *bzr_local;
  UpdateParser *this_local;
  
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__UpdateParser_01675ae0;
  this->BZR = bzr;
  cmsys::RegularExpression::RegularExpression(&this->RegexUpdate);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(bzr->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexUpdate,"^([-+R?XCP ])([NDKM ])([* ]) +(.+)$");
  return;
}

Assistant:

UpdateParser(cmCTestBZR* bzr, const char* prefix)
    : BZR(bzr)
  {
    this->SetLog(&bzr->Log, prefix);
    this->RegexUpdate.compile("^([-+R?XCP ])([NDKM ])([* ]) +(.+)$");
  }